

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampleapp.cpp
# Opt level: O1

void __thiscall SampleApp::SampleApp(SampleApp *this,int *argc,char **argv)

{
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QString local_48;
  QArrayData *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_00106ce0;
  QVar1.m_data = (storage_type *)0xa;
  QVar1.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar1);
  local_48.d.d = (Data *)local_28;
  local_48.d.ptr = pcStack_20;
  local_48.d.size = local_18;
  QCoreApplication::setApplicationName(&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  QVar2.m_data = (storage_type *)0x3;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  local_48.d.d = (Data *)local_28;
  local_48.d.ptr = pcStack_20;
  local_48.d.size = local_18;
  QCoreApplication::setApplicationVersion(&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

SampleApp::SampleApp(int &argc, char *argv[]) :
    QApplication(argc, argv)
{
    setApplicationName("Sample App");
    setApplicationVersion("0.1");
}